

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O2

void ulist_deleteList_63(UList *list)

{
  UListNode *pUVar1;
  UListNode *buffer;
  
  if (list != (UList *)0x0) {
    buffer = list->head;
    while (buffer != (UListNode *)0x0) {
      pUVar1 = buffer->next;
      if (buffer->forceDelete != '\0') {
        uprv_free_63(buffer->data);
      }
      uprv_free_63(buffer);
      buffer = pUVar1;
    }
    uprv_free_63(list);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2 ulist_deleteList(UList *list) {
    UListNode *listHead = NULL;

    if (list != NULL) {
        listHead = list->head;
        while (listHead != NULL) {
            UListNode *listPointer = listHead->next;

            if (listHead->forceDelete) {
                uprv_free(listHead->data);
            }

            uprv_free(listHead);
            listHead = listPointer;
        }
        uprv_free(list);
        list = NULL;
    }
}